

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  _xmlDoc *doc;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar3 = reader->node;
  if (reader->curnode != (xmlNodePtr)0x0) {
    pxVar3 = reader->curnode;
  }
  xVar1 = pxVar3->type;
  if (xVar1 < XML_XINCLUDE_START) {
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (xVar1 == XML_ATTRIBUTE_NODE) {
        if (pxVar3->children == (xmlNode *)0x0) {
          return (xmlChar *)0x0;
        }
        if (pxVar3->parent == (_xmlNode *)0x0) {
          doc = (xmlDocPtr)0x0;
        }
        else {
          doc = pxVar3->parent->doc;
        }
        pxVar2 = xmlNodeListGetString(doc,pxVar3->children,1);
        if (pxVar2 == (xmlChar *)0x0) {
          xmlTextReaderErrMemory(reader);
          return (xmlChar *)0x0;
        }
        return pxVar2;
      }
      if (xVar1 != XML_NAMESPACE_DECL) {
        return (xmlChar *)0x0;
      }
      pxVar2 = pxVar3->name;
    }
    else {
      pxVar2 = pxVar3->content;
    }
    pxVar2 = readerStrdup(reader,pxVar2);
    return pxVar2;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_NAMESPACE_DECL:
	    return(readerStrdup(reader, ((xmlNsPtr) node)->href));
        case XML_ATTRIBUTE_NODE:{
	    xmlAttrPtr attr = (xmlAttrPtr) node;
            xmlDocPtr doc = NULL;
            xmlChar *ret;

            if (attr->children == NULL)
                return(NULL);
	    if (attr->parent != NULL)
                doc = attr->parent->doc;
	    ret = xmlNodeListGetString(doc, attr->children, 1);
            if (ret == NULL)
                xmlTextReaderErrMemory(reader);
	    return(ret);
	}
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
            return(readerStrdup(reader, node->content));
	default:
	    break;
    }
    return(NULL);
}